

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_crt_check_san_ip(mbedtls_x509_sequence *san,char *cn,size_t cn_len)

{
  int iVar1;
  mbedtls_asn1_sequence *pmStack_40;
  uchar san_type;
  mbedtls_x509_sequence *cur;
  uint32_t ip [4];
  size_t cn_len_local;
  char *cn_local;
  mbedtls_x509_sequence *san_local;
  
  ip._8_8_ = cn_len;
  ip._8_8_ = mbedtls_x509_crt_parse_cn_inet_pton(cn,&cur);
  pmStack_40 = san;
  if (ip._8_8_ != 0) {
    for (; pmStack_40 != (mbedtls_x509_sequence *)0x0; pmStack_40 = pmStack_40->next) {
      if (((((byte)(pmStack_40->buf).tag & 0x1f) == 7) && ((pmStack_40->buf).len == ip._8_8_)) &&
         (iVar1 = memcmp((pmStack_40->buf).p,&cur,ip._8_8_), iVar1 == 0)) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int x509_crt_check_san_ip(const mbedtls_x509_sequence *san,
                                 const char *cn, size_t cn_len)
{
    uint32_t ip[4];
    cn_len = mbedtls_x509_crt_parse_cn_inet_pton(cn, ip);
    if (cn_len == 0) {
        return -1;
    }

    for (const mbedtls_x509_sequence *cur = san; cur != NULL; cur = cur->next) {
        const unsigned char san_type = (unsigned char) cur->buf.tag &
                                       MBEDTLS_ASN1_TAG_VALUE_MASK;
        if (san_type == MBEDTLS_X509_SAN_IP_ADDRESS &&
            cur->buf.len == cn_len && memcmp(cur->buf.p, ip, cn_len) == 0) {
            return 0;
        }
    }

    return -1;
}